

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void dpfb::args::getValue(char ***cursor,char **optArgsEnd,int *var)

{
  long lVar1;
  char *end;
  
  advanceToArg(cursor,optArgsEnd);
  lVar1 = strtol(**cursor,&end,10);
  *var = (int)lVar1;
  if (**cursor != end) {
    return;
  }
  fprintf(_stderr,"Invalid %s: %s\n",(*cursor)[-1]);
  exit(1);
}

Assistant:

static void getValue(char**& cursor, char** optArgsEnd, int& var)
{
    advanceToArg(cursor, optArgsEnd);

    char* end;
    var = std::strtol(*cursor, &end, 10);
    if (*cursor == end) {
        std::fprintf(stderr, "Invalid %s: %s\n", *(cursor - 1), *cursor);
        std::exit(EXIT_FAILURE);
    }
}